

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall ncnn::Convolution::load_model(Convolution *this,ModelBin *mb)

{
  Mat *this_00;
  float fVar1;
  float fVar2;
  size_t sVar3;
  Option *pOVar4;
  Layer *pLVar5;
  int iVar6;
  Mat int8_weight_data;
  ModelBinFromMatArray local_550;
  ParamDict pd;
  
  (**mb->_vptr_ModelBin)(&pd,mb,(ulong)(uint)this->weight_data_size,0);
  this_00 = &this->weight_data;
  Mat::operator=(this_00,(Mat *)&pd);
  Mat::~Mat((Mat *)&pd);
  iVar6 = -100;
  if ((this_00->data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (**mb->_vptr_ModelBin)(&pd,mb,(ulong)(uint)this->num_output,1);
      Mat::operator=(&this->bias_data,(Mat *)&pd);
      Mat::~Mat((Mat *)&pd);
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    if (this->int8_scale_term != 0) {
      (**mb->_vptr_ModelBin)(&pd,mb,1,1);
      this->weight_data_int8_scale = *(float *)pd._0_8_;
      Mat::~Mat((Mat *)&pd);
      (**mb->_vptr_ModelBin)(&pd,mb,1,1);
      this->bottom_blob_int8_scale = *(float *)pd._0_8_;
      Mat::~Mat((Mat *)&pd);
    }
    sVar3 = (this->weight_data).elemsize;
    if (sVar3 == 4) {
      if (this->use_int8_inference == true) {
        pLVar5 = create_layer(0x39);
        ParamDict::ParamDict(&pd);
        ParamDict::set(&pd,0,this->weight_data_int8_scale);
        (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
        int8_weight_data.dims = 0;
        int8_weight_data.w = 0;
        int8_weight_data.h = 0;
        int8_weight_data.c = 0;
        int8_weight_data.elemsize = 0;
        int8_weight_data.allocator = (Allocator *)0x0;
        int8_weight_data.data = (void *)0x0;
        int8_weight_data.refcount = (int *)0x0;
        int8_weight_data.cstep = 0;
        pOVar4 = get_default_option();
        (*pLVar5->_vptr_Layer[5])(pLVar5,this_00,&int8_weight_data,pOVar4);
        (*pLVar5->_vptr_Layer[1])(pLVar5);
        if ((int8_weight_data.data == (void *)0x0) ||
           ((long)int8_weight_data.c * int8_weight_data.cstep == 0)) {
          Mat::~Mat(&int8_weight_data);
          ParamDict::~ParamDict(&pd);
          return -100;
        }
        Mat::operator=(this_00,&int8_weight_data);
        Mat::~Mat(&int8_weight_data);
        ParamDict::~ParamDict(&pd);
      }
    }
    else if ((sVar3 == 1) && (this->use_int8_inference == false)) {
      fwrite("quantized int8 weight loaded but use_int8_inference disabled\n",0x3d,1,_stderr);
      return -1;
    }
    iVar6 = 0;
    if (this->use_int8_inference == true) {
      pLVar5 = create_layer(0x39);
      this->quantize = pLVar5;
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,this->bottom_blob_int8_scale);
      (*this->quantize->_vptr_Layer[2])();
      ParamDict::~ParamDict(&pd);
      pLVar5 = create_layer(0x3a);
      this->dequantize = pLVar5;
      fVar1 = this->weight_data_int8_scale;
      fVar2 = this->bottom_blob_int8_scale;
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,1.0 / (fVar1 * fVar2));
      ParamDict::set(&pd,1,this->bias_term);
      ParamDict::set(&pd,2,this->num_output);
      (*this->dequantize->_vptr_Layer[2])(this->dequantize,&pd);
      int8_weight_data.dims = 0;
      int8_weight_data.w = 0;
      int8_weight_data.h = 0;
      int8_weight_data.c = 0;
      int8_weight_data.elemsize = 0;
      int8_weight_data.allocator = (Allocator *)0x0;
      int8_weight_data.data = (void *)0x0;
      int8_weight_data.refcount = (int *)0x0;
      int8_weight_data.cstep = 0;
      Mat::operator=(&int8_weight_data,&this->bias_data);
      pLVar5 = this->dequantize;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_550,&int8_weight_data);
      (*pLVar5->_vptr_Layer[3])(pLVar5,&local_550);
      Mat::~Mat(&int8_weight_data);
      ParamDict::~ParamDict(&pd);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int Convolution::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term)
    {
        weight_data_int8_scale = mb.load(1, 1)[0];
        bottom_blob_int8_scale = mb.load(1, 1)[0];
    }

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

        ncnn::ParamDict pd;
        pd.set(0, weight_data_int8_scale);// scale

        op->load_param(pd);

        Mat int8_weight_data;
        op->forward(weight_data, int8_weight_data);

        delete op;

        if (int8_weight_data.empty())
            return -100;

        weight_data = int8_weight_data;
    }

    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);
        }

        dequantize = ncnn::create_layer(ncnn::LayerType::Dequantize);
        {
            float top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scale);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, num_output);// bias_data_size

            dequantize->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data;

            dequantize->load_model(ModelBinFromMatArray(weights));
        }
    }

    return 0;
}